

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>>
           (uint *begin,uint *end)

{
  uint *puVar1;
  double *pdVar2;
  double dVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  int __tmp;
  ulong uVar7;
  uint *puVar8;
  long lVar9;
  uint *puVar10;
  uint *puVar11;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
  pVar12;
  
  uVar5 = *begin;
  dVar3 = *(double *)(begin + 2);
  lVar9 = 0x10;
  while( true ) {
    uVar6 = *(uint *)((long)begin + lVar9);
    uVar7 = (ulong)uVar6;
    if (((int)uVar5 <= (int)uVar6) &&
       (((int)uVar5 < (int)uVar6 ||
        (pdVar2 = (double *)((long)begin + lVar9 + 8), dVar3 < *pdVar2 || dVar3 == *pdVar2))))
    break;
    lVar9 = lVar9 + 0x10;
  }
  puVar1 = (uint *)((long)begin + lVar9);
  puVar11 = puVar1;
  if (lVar9 == 0x10) {
    for (puVar10 = end + -4;
        ((end = puVar10 + 4, puVar8 = end, puVar1 < end &&
         (end = puVar10, puVar8 = puVar10, (int)uVar5 <= (int)*puVar10)) &&
        (((int)uVar5 < (int)*puVar10 ||
         (dVar3 < *(double *)(puVar10 + 2) || dVar3 == *(double *)(puVar10 + 2)))));
        puVar10 = puVar10 + -4) {
    }
  }
  else {
    do {
      puVar10 = end;
      end = puVar10 + -4;
      puVar8 = end;
      if ((int)*end < (int)uVar5) break;
    } while (((int)uVar5 < (int)*end) ||
            (pdVar2 = (double *)(puVar10 + -2), dVar3 < *pdVar2 || dVar3 == *pdVar2));
  }
  do {
    if (end <= puVar11) {
      pVar12._9_7_ = (undefined7)(uVar7 >> 8);
      pVar12.second = puVar8 <= puVar1;
      *begin = puVar11[-4];
      *(undefined8 *)(begin + 2) = *(undefined8 *)(puVar11 + -2);
      puVar11[-4] = uVar5;
      *(double *)(puVar11 + -2) = dVar3;
      pVar12.first._M_current = (pair<int,_double> *)(puVar11 + -4);
      return pVar12;
    }
    *puVar11 = *end;
    *end = (uint)uVar7;
    uVar4 = *(undefined8 *)(puVar11 + 2);
    *(undefined8 *)(puVar11 + 2) = *(undefined8 *)(end + 2);
    *(undefined8 *)(end + 2) = uVar4;
    do {
      do {
        puVar10 = puVar11;
        puVar11 = puVar10 + 4;
        uVar6 = *puVar11;
        uVar7 = (ulong)uVar6;
      } while ((int)uVar6 < (int)uVar5);
    } while (((int)uVar6 <= (int)uVar5) &&
            (pdVar2 = (double *)(puVar10 + 6), *pdVar2 <= dVar3 && dVar3 != *pdVar2));
    do {
      puVar10 = end;
      end = puVar10 + -4;
      if ((int)*end < (int)uVar5) break;
    } while (((int)uVar5 < (int)*end) ||
            (pdVar2 = (double *)(puVar10 + -2), dVar3 < *pdVar2 || dVar3 == *pdVar2));
  } while( true );
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }